

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

void inner_update_cb_state_and_predict(update_data *d,float x,float *wref)

{
  long in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  double dVar1;
  float fabs_x;
  float w_xt;
  float w_mx;
  float *w;
  undefined4 local_28;
  undefined4 local_24;
  
  local_24 = *(float *)(in_RSI + 0xc);
  local_28 = 0.0;
  dVar1 = std::fabs((double)(ulong)(uint)in_XMM0_Da);
  if (local_24 < SUB84(dVar1,0)) {
    local_24 = SUB84(dVar1,0);
  }
  if (0.0 < *(float *)(in_RSI + 0x14) * local_24) {
    local_28 = ((*(float *)(in_RDI + 4) + *(float *)(in_RSI + 0x10)) * *(float *)(in_RSI + 4)) /
               (*(float *)(in_RSI + 0x14) * local_24 *
               (*(float *)(in_RSI + 0x14) * local_24 + *(float *)(in_RSI + 8)));
  }
  *(float *)(in_RDI + 0x14) = local_28 * in_XMM0_Da + *(float *)(in_RDI + 0x14);
  if (0.0 < local_24) {
    *(float *)(in_RDI + 0x18) =
         (in_XMM0_Da * in_XMM0_Da) / (local_24 * local_24) + *(float *)(in_RDI + 0x18);
  }
  return;
}

Assistant:

void inner_update_cb_state_and_predict(update_data& d, float x, float& wref)
{
  float* w = &wref;
  float w_mx = w[W_MX];
  float w_xt = 0.0;

  float fabs_x = fabs(x);
  if (fabs_x > w_mx) {
    w_mx = fabs_x;
  }

  // COCOB update without sigmoid
  if (w[W_MG]*w_mx>0)
    w_xt = (d.ftrl_alpha+w[W_WE]) * w[W_ZT]/(w[W_MG]*w_mx*(w[W_MG]*w_mx+w[W_G2]));

  d.predict += w_xt * x;
  if (w_mx>0)
    d.normalized_squared_norm_x += x*x/(w_mx*w_mx);
}